

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionEntryPointInfo::Expire(FunctionEntryPointInfo *this)

{
  undefined1 *puVar1;
  uint sourceContextId;
  FunctionProxy *pFVar2;
  ThreadContext *this_00;
  FunctionBody *pFVar3;
  Type pSVar4;
  undefined8 *puVar5;
  ScriptFunctionType *pSVar6;
  PVOID dynamicInterpreterThunk;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar7;
  State SVar8;
  bool bVar9;
  ExecutionMode EVar10;
  LocalFunctionId functionId;
  int iVar11;
  undefined4 *puVar12;
  FunctionInfo *pFVar13;
  FunctionEntryPointInfo *pFVar14;
  FunctionEntryPointInfo *pFVar15;
  void *pvVar16;
  code *pcVar17;
  JavascriptMethod p_Var18;
  JavascriptMethod p_Var19;
  long lVar20;
  FunctionEntryPointInfo *strongRef;
  long lVar21;
  anon_class_16_2_2511f9eb local_60;
  FunctionEntryPointInfo *local_50;
  FunctionBody *local_48;
  AutoNestedHandledExceptionType local_3c;
  FunctionEntryPointInfo *pFStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  FunctionEntryPointInfo *newEntryPoint;
  
  if (((this->lastCallsCount == this->callsCount) &&
      (((this->super_EntryPointInfo).field_0x18 & 0x10) != 0)) &&
     (SVar8 = EntryPointInfo::GetState(&this->super_EntryPointInfo), SVar8 != CleanedUp)) {
    pFVar2 = (this->functionProxy).ptr;
    pFVar13 = (pFVar2->functionInfo).ptr;
    this_00 = pFVar2->m_scriptContext->threadContext;
    if (pFVar13 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4f1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar9) goto LAB_007748c0;
      *puVar12 = 0;
      pFVar13 = (pFVar2->functionInfo).ptr;
    }
    if ((pFVar13->functionBodyImpl).ptr != pFVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4f2,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar9) goto LAB_007748c0;
      *puVar12 = 0;
      pFVar13 = (pFVar2->functionInfo).ptr;
    }
    if ((pFVar13->attributes & (DeferredParse|DeferredDeserialize)) != None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x2475,"(!this->functionProxy->IsDeferred())",
                                  "!this->functionProxy->IsDeferred()");
      if (!bVar9) goto LAB_007748c0;
      *puVar12 = 0;
    }
    pFVar3 = (FunctionBody *)(this->functionProxy).ptr;
    bVar9 = FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar3);
    if (!bVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar9) goto LAB_007748c0;
      *puVar12 = 0;
    }
    pFVar14 = (FunctionEntryPointInfo *)
              FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar3,SimpleJitEntryPointInfo);
    local_50 = pFVar14;
    if (pFVar14 == this) {
      EVar10 = FunctionExecutionStateMachine::GetExecutionMode(&pFVar3->executionState);
      if (EVar10 != FullJit) {
        return;
      }
      pFVar14 = (FunctionEntryPointInfo *)0x0;
      FunctionProxy::SetAuxPtr((FunctionProxy *)pFVar3,SimpleJitEntryPointInfo,(void *)0x0);
    }
    local_48 = pFVar3;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_3c,ExceptionType_OutOfMemory);
    pFStack_38 = (FunctionEntryPointInfo *)0x0;
    pFVar15 = FunctionBody::GetDefaultFunctionEntryPointInfo(pFVar3);
    if (pFVar15 == this) {
      if (pFVar14 == (FunctionEntryPointInfo *)0x0) {
        if (((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) == 0) {
          pFStack_38 = FunctionBody::CreateNewDefaultEntryPoint(pFVar3);
          pFVar3->field_0x179 = pFVar3->field_0x179 & 0x7f;
          FunctionExecutionStateMachine::ReinitializeExecutionModeAndLimits
                    (&pFVar3->executionState,pFVar3);
          sourceContextId =
               ((((((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)
                  ->m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
          functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar3);
          bVar9 = Phases::IsEnabled((Phases *)&DAT_015a4e90,BackEndPhase,sourceContextId,functionId)
          ;
          if ((!bVar9) &&
             (pSVar4 = (pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,
             (pSVar4->config).NoNative == false)) {
            GenerateFunction(pSVar4->nativeCodeGen,pFVar3,(ScriptFunction *)0x0);
          }
        }
        else {
          pFStack_38 = FunctionBody::CreateNewDefaultEntryPoint(pFVar3);
          puVar1 = &(pFStack_38->super_EntryPointInfo).field_0x18;
          *puVar1 = *puVar1 | 8;
          (pFStack_38->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod =
               InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk;
          pFVar3->field_0x17b = pFVar3->field_0x17b & 0x7f;
          FunctionExecutionStateMachine::SetDefaultInterpreterExecutionMode(&pFVar3->executionState)
          ;
          FunctionProxy::SetOriginalEntryPoint
                    ((this->functionProxy).ptr,
                     InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk);
        }
      }
      else {
        pFStack_38 = pFVar14;
        p_Var19 = EntryPointInfo::GetNativeEntrypoint(&pFVar14->super_EntryPointInfo);
        FunctionBody::SetDefaultFunctionEntryPointInfo(pFVar3,pFVar14,p_Var19);
        FunctionBody::ResetSimpleJitLimitAndCallCount(pFVar3);
      }
      FunctionBody::TraceExecutionMode(pFVar3,"JitCodeExpired");
      pFVar15 = pFStack_38;
    }
    pFStack_38 = pFVar15;
    Output::Trace(ExpirableCollectPhase,L"Expiring 0x%p\n",this);
    pFVar2 = (this->functionProxy).ptr;
    local_60.newEntryPoint = &stack0xffffffffffffffc8;
    local_60.this = this;
    pvVar16 = FunctionProxy::GetAuxPtr(pFVar2,FunctionObjectTypeList);
    if ((pvVar16 != (void *)0x0) && (iVar11 = *(int *)((long)pvVar16 + 0x10), 0 < iVar11)) {
      lVar21 = 0;
      do {
        puVar5 = *(undefined8 **)(*(long *)((long)pvVar16 + 8) + lVar21 * 8);
        if ((((ulong)puVar5 & 1) == 0 && puVar5 != (undefined8 *)0x0) &&
           ((ScriptFunctionType *)*puVar5 != (ScriptFunctionType *)0x0)) {
          Expire::anon_class_16_2_2511f9eb::operator()(&local_60,(ScriptFunctionType *)*puVar5);
          iVar11 = *(int *)((long)pvVar16 + 0x10);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < iVar11);
    }
    pFVar3 = local_48;
    pSVar6 = (pFVar2->deferredPrototypeType).ptr;
    if (pSVar6 != (ScriptFunctionType *)0x0) {
      Expire::anon_class_16_2_2511f9eb::operator()(&local_60,pSVar6);
    }
    pSVar6 = (pFVar2->undeferredFunctionType).ptr;
    if (pSVar6 != (ScriptFunctionType *)0x0) {
      Expire::anon_class_16_2_2511f9eb::operator()(&local_60,pSVar6);
    }
    if (local_50 == this) {
      dynamicInterpreterThunk = (pFVar3->super_ParseableFunctionInfo).m_dynamicInterpreterThunk;
      if (dynamicInterpreterThunk == (PVOID)0x0) {
        pcVar17 = InterpreterStackFrame::DelayDynamicInterpreterThunk;
      }
      else {
        pcVar17 = (code *)InterpreterThunkEmitter::ConvertToEntryPoint(dynamicInterpreterThunk);
      }
      p_Var19 = ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                CurrentThunk;
      if (p_Var19 == InterpreterStackFrame::DelayDynamicInterpreterThunk) {
        p_Var19 = pcVar17;
      }
      p_Var18 = EntryPointInfo::GetNativeEntrypoint(&this->super_EntryPointInfo);
      pSVar7 = (pFVar3->entryPoints).ptr;
      if ((pSVar7 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                      *)0x0) &&
         (lVar21 = (long)(pSVar7->
                         super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                         ).
                         super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                         .count, 0 < lVar21)) {
        lVar20 = 0;
        do {
          pFVar14 = (FunctionEntryPointInfo *)
                    (((pSVar7->
                      super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ).
                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                      .buffer.ptr[lVar20].ptr)->super_RecyclerWeakReferenceBase).strongRef;
          if ((pFVar14 != this && pFVar14 != (FunctionEntryPointInfo *)0x0) &&
             ((pFVar14->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod == (Type)p_Var18))
          {
            (pFVar14->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod = (Type)p_Var19;
          }
          lVar20 = lVar20 + 1;
        } while (lVar21 != lVar20);
      }
      pFVar13 = (pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar13 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar9) goto LAB_007748c0;
        *puVar12 = 0;
        pFVar13 = (pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      if ((FunctionBody *)(pFVar13->functionBodyImpl).ptr != pFVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                    "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar9) {
LAB_007748c0:
          pcVar17 = (code *)invalidInstructionException();
          (*pcVar17)();
        }
        *puVar12 = 0;
        pFVar13 = (pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      p_Var19 = FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar13);
      if (p_Var19 == p_Var18) {
        FunctionProxy::SetOriginalEntryPoint((FunctionProxy *)pFVar3,pcVar17);
        FunctionProxy::VerifyOriginalEntryPoint((FunctionProxy *)pFVar3);
      }
    }
    ThreadContext::QueueFreeOldEntryPointInfoIfInScript(this_00,this);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
  }
  return;
}

Assistant:

void FunctionEntryPointInfo::Expire()
    {
        if (this->lastCallsCount != this->callsCount || !this->IsNativeEntryPointProcessed() || this->IsCleanedUp())
        {
            return;
        }

        ThreadContext* threadContext = this->functionProxy->GetScriptContext()->GetThreadContext();

        Assert(!this->functionProxy->IsDeferred());
        FunctionBody* functionBody = this->functionProxy->GetFunctionBody();

        FunctionEntryPointInfo *simpleJitEntryPointInfo = functionBody->GetSimpleJitEntryPointInfo();
        const bool expiringSimpleJitEntryPointInfo = simpleJitEntryPointInfo == this;
        if(expiringSimpleJitEntryPointInfo)
        {
            if(functionBody->GetExecutionMode() != ExecutionMode::FullJit)
            {
                // Don't expire simple JIT code until the transition to full JIT
                return;
            }
            simpleJitEntryPointInfo = nullptr;
            functionBody->SetSimpleJitEntryPointInfo(nullptr);
        }

        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);

            FunctionEntryPointInfo* newEntryPoint = nullptr;
            FunctionEntryPointInfo *const defaultEntryPointInfo = functionBody->GetDefaultFunctionEntryPointInfo();
            if(this == defaultEntryPointInfo)
            {
                if(simpleJitEntryPointInfo)
                {
                    newEntryPoint = simpleJitEntryPointInfo;
                    functionBody->SetDefaultFunctionEntryPointInfo(simpleJitEntryPointInfo, newEntryPoint->GetNativeEntrypoint());
                    functionBody->ResetSimpleJitLimitAndCallCount();
                }
#ifdef ASMJS_PLAT
                else if (functionBody->GetIsAsmJsFunction())
                {
                    // the new entrypoint will be set to interpreter
                    newEntryPoint = functionBody->CreateNewDefaultEntryPoint();
                    newEntryPoint->SetIsAsmJSFunction(true);
                    newEntryPoint->jsMethod = AsmJsDefaultEntryThunk;
                    functionBody->SetIsAsmJsFullJitScheduled(false);
                    functionBody->SetDefaultInterpreterExecutionMode();
                    this->functionProxy->SetOriginalEntryPoint(AsmJsDefaultEntryThunk);
                }
#endif
                else
                {
                    newEntryPoint = functionBody->CreateNewDefaultEntryPoint();
                    functionBody->ReinitializeExecutionModeAndLimits();
#if ENABLE_NATIVE_CODEGEN
                    // In order for the function to ever get JIT again, we need to call GenerateFunction now
                    if (!PHASE_OFF(Js::BackEndPhase, functionBody) && !functionBody->GetScriptContext()->GetConfig()->IsNoNative())
                    {
                        GenerateFunction(functionBody->GetScriptContext()->GetNativeCodeGenerator(), functionBody);
                    }
#endif
                }
                functionBody->TraceExecutionMode("JitCodeExpired");
            }
            else
            {
                newEntryPoint = defaultEntryPointInfo;
            }

            OUTPUT_TRACE(Js::ExpirableCollectPhase,  _u("Expiring 0x%p\n"), this);
            this->functionProxy->MapFunctionObjectTypes([&] (ScriptFunctionType* functionType)
            {
                Assert(functionType->GetTypeId() == TypeIds_Function);

                if (functionType->GetEntryPointInfo() == this)
                {
                    OUTPUT_TRACE(Js::ExpirableCollectPhase, _u("Type 0x%p uses this entry point- switching to default entry point\n"), this);
                    functionType->SetEntryPointInfo(newEntryPoint);
                    // we are allowed to replace the entry point on the type only if it's
                    // directly using the jitted code or a type is referencing this entry point
                    // but the entry point hasn't been called since the codegen thunk was installed on it
                    if (functionType->GetEntryPoint() == functionProxy->GetDirectEntryPoint(this) || IsIntermediateCodeGenThunk(functionType->GetEntryPoint()))
                    {
                        functionType->SetEntryPoint(this->functionProxy->GetDirectEntryPoint(newEntryPoint));
                    }
                }
                else
                {
                    Assert(!functionType->GetEntryPointInfo()->IsFunctionEntryPointInfo() ||
                        ((FunctionEntryPointInfo*)functionType->GetEntryPointInfo())->IsCleanedUp()
                        || functionType->GetEntryPoint() != this->GetNativeEntrypoint());
                }
            });

            if(expiringSimpleJitEntryPointInfo)
            {
                // We could have just created a new entry point info that is using the simple JIT code. An allocation may have
                // triggered shortly after, resulting in expiring the simple JIT entry point info. Update any entry point infos
                // that are using the simple JIT code, and update the original entry point as necessary as well.
                const JavascriptMethod newOriginalEntryPoint =
                    functionBody->GetDynamicInterpreterEntryPoint()
                        ?   reinterpret_cast<JavascriptMethod>(
                                InterpreterThunkEmitter::ConvertToEntryPoint(functionBody->GetDynamicInterpreterEntryPoint()))
                        :   DefaultEntryThunk;
                const JavascriptMethod currentThunk = functionBody->GetScriptContext()->CurrentThunk;
                const JavascriptMethod newDirectEntryPoint =
                    currentThunk == DefaultEntryThunk ? newOriginalEntryPoint : currentThunk;
                const JavascriptMethod simpleJitNativeAddress = GetNativeEntrypoint();
                functionBody->MapEntryPoints([&](const int entryPointIndex, FunctionEntryPointInfo *const entryPointInfo)
                {
                    if(entryPointInfo != this && entryPointInfo->jsMethod == simpleJitNativeAddress)
                    {
                        entryPointInfo->jsMethod = newDirectEntryPoint;
                    }
                });
                if(functionBody->GetOriginalEntryPoint_Unchecked() == simpleJitNativeAddress)
                {
                    functionBody->SetOriginalEntryPoint(newOriginalEntryPoint);
                    functionBody->VerifyOriginalEntryPoint();
                }
            }

            threadContext->QueueFreeOldEntryPointInfoIfInScript(this);
        }